

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.c
# Opt level: O0

ZyanStatus ZyanStringAppendDecU(ZyanString *string,ZyanU64 value,ZyanU8 padding_length)

{
  ZyanStatus ZVar1;
  ZyanU8 padding_length_local;
  ZyanU64 value_local;
  ZyanString *string_local;
  
  ZVar1 = ZyanStringAppendDecU64(string,value,padding_length);
  return ZVar1;
}

Assistant:

ZyanStatus ZyanStringAppendDecU(ZyanString* string, ZyanU64 value, ZyanU8 padding_length)
{
#if defined(ZYAN_X64) || defined(ZYAN_AARCH64) || defined(ZYAN_PPC64) || defined(ZYAN_RISCV64) || defined(ZYAN_LOONGARCH)
    return ZyanStringAppendDecU64(string, value, padding_length);
#else
    // Working with 64-bit values is slow on non 64-bit systems
    if (value & 0xFFFFFFFF00000000)
    {
        return ZyanStringAppendDecU64(string, value, padding_length);
    }
    return ZyanStringAppendDecU32(string, (ZyanU32)value, padding_length);
#endif
}